

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuEvent>::insert
          (QMovableArrayOps<QDBusMenuEvent> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  undefined8 in_RCX;
  QArrayDataPointer<QDBusMenuEvent> *in_RDX;
  long in_RSI;
  QDBusMenuEvent *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  GrowthPosition pos;
  bool growsAtBegin;
  QDBusMenuEvent copy;
  QDBusMenuEvent *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff64;
  uint uVar4;
  GrowthPosition where;
  QArrayDataPointer<QDBusMenuEvent> *pQVar5;
  undefined1 local_50 [72];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RCX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_50,0xaa,0x48);
  QDBusMenuEvent::QDBusMenuEvent(in_RDI,in_stack_ffffffffffffff48);
  bVar2 = (in_RDI->m_eventId).d.ptr != (char16_t *)0x0;
  uVar3 = bVar2 && in_RSI == 0;
  uVar4 = CONCAT13(uVar3,(int3)in_stack_ffffffffffffff64);
  uVar1 = (uint)(bVar2 && in_RSI == 0);
  QArrayDataPointer<QDBusMenuEvent>::detachAndGrow
            (in_RDX,where,CONCAT44(uVar4,uVar1),
             (QDBusMenuEvent **)CONCAT17(uVar3,in_stack_ffffffffffffff58),
             (QArrayDataPointer<QDBusMenuEvent> *)in_RDI);
  if ((uVar4 & 0x1000000) == 0) {
    Inserter::Inserter((Inserter *)CONCAT44(uVar4,uVar1),
                       (QArrayDataPointer<QDBusMenuEvent> *)
                       CONCAT17(uVar3,in_stack_ffffffffffffff58),(qsizetype)in_RDI,
                       (qsizetype)in_stack_ffffffffffffff48);
    Inserter::insertFill
              ((Inserter *)CONCAT44(uVar4,uVar1),
               (QDBusMenuEvent *)CONCAT17(uVar3,in_stack_ffffffffffffff58),(qsizetype)in_RDI);
    Inserter::~Inserter((Inserter *)in_RDI);
  }
  else {
    while (pQVar5 = (QArrayDataPointer<QDBusMenuEvent> *)((long)&in_RDX[-1].size + 7),
          in_RDX != (QArrayDataPointer<QDBusMenuEvent> *)0x0) {
      QArrayDataPointer<QDBusMenuEvent>::begin((QArrayDataPointer<QDBusMenuEvent> *)0xb0fad0);
      QDBusMenuEvent::QDBusMenuEvent(in_RDI,in_stack_ffffffffffffff48);
      (in_RDI->m_eventId).d.d = (Data *)&(in_RDI->m_eventId).d.d[-5].super_QArrayData.alloc;
      (in_RDI->m_eventId).d.ptr = (char16_t *)((long)(in_RDI->m_eventId).d.ptr + 1);
      in_RDX = pQVar5;
    }
  }
  QDBusMenuEvent::~QDBusMenuEvent(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }